

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

char * __thiscall
google::protobuf::DescriptorProto_ExtensionRange::_InternalParse
          (DescriptorProto_ExtensionRange *this,char *ptr,ParseContext *ctx)

{
  InternalMetadata *this_00;
  byte bVar1;
  bool bVar2;
  ExtensionRangeOptions *msg;
  uint uVar3;
  UnknownFieldSet *unknown;
  byte *p;
  Arena *arena;
  char cVar4;
  uint uVar5;
  uint uVar6;
  pair<const_char_*,_unsigned_int> pVar7;
  pair<const_char_*,_unsigned_long> pVar8;
  byte *local_38;
  char *ptr_local;
  
  local_38 = (byte *)ptr;
  bVar2 = internal::EpsCopyInputStream::DoneWithCheck
                    (&ctx->super_EpsCopyInputStream,(char **)&local_38,ctx->group_depth_);
  uVar6 = 0;
  if (!bVar2) {
    this_00 = &(this->super_Message).super_MessageLite._internal_metadata_;
    uVar6 = 0;
    do {
      bVar1 = *local_38;
      uVar5 = (uint)bVar1;
      p = local_38 + 1;
      if ((char)bVar1 < '\0') {
        uVar5 = ((uint)bVar1 + (uint)*p * 0x80) - 0x80;
        if (-1 < (char)*p) {
          p = local_38 + 2;
          goto LAB_0029410c;
        }
        pVar7 = internal::ReadTagFallback((char *)local_38,uVar5);
        p = (byte *)pVar7.first;
        if (p != (byte *)0x0) {
          uVar5 = pVar7.second;
          goto LAB_0029410c;
        }
LAB_002942b6:
        local_38 = (byte *)0x0;
        break;
      }
LAB_0029410c:
      uVar3 = uVar5 >> 3;
      cVar4 = (char)uVar5;
      local_38 = p;
      if (uVar3 == 3) {
        if (cVar4 != '\x1a') goto LAB_002941ea;
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
        msg = this->options_;
        if (msg == (ExtensionRangeOptions *)0x0) {
          arena = (Arena *)this_00->ptr_;
          if (((ulong)arena & 1) != 0) {
            arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
          }
          msg = Arena::CreateMaybeMessage<google::protobuf::ExtensionRangeOptions>(arena);
          this->options_ = msg;
        }
        local_38 = (byte *)internal::ParseContext::
                           ParseMessage<google::protobuf::ExtensionRangeOptions>
                                     (ctx,msg,(char *)local_38);
LAB_00294229:
        if (local_38 == (byte *)0x0) goto LAB_002942b6;
      }
      else if (uVar3 == 2) {
        if (cVar4 != '\x10') goto LAB_002941ea;
        uVar6 = uVar6 | 4;
        bVar1 = *p;
        uVar5 = (uint)bVar1;
        local_38 = p + 1;
        if ((char)bVar1 < '\0') {
          uVar5 = ((uint)bVar1 + (uint)*local_38 * 0x80) - 0x80;
          if ((char)*local_38 < '\0') {
            local_38 = p;
            pVar8 = internal::VarintParseSlow64((char *)p,uVar5);
            local_38 = (byte *)pVar8.first;
            this->end_ = (int32)pVar8.second;
            goto LAB_00294229;
          }
          local_38 = p + 2;
        }
        this->end_ = uVar5;
      }
      else {
        if ((uVar3 != 1) || (cVar4 != '\b')) {
LAB_002941ea:
          if ((uVar5 != 0) && ((uVar5 & 7) != 4)) {
            if (((ulong)this_00->ptr_ & 1) == 0) {
              unknown = internal::InternalMetadata::
                        mutable_unknown_fields_slow<google::protobuf::UnknownFieldSet>(this_00);
            }
            else {
              unknown = (UnknownFieldSet *)(((ulong)this_00->ptr_ & 0xfffffffffffffffe) + 8);
            }
            local_38 = (byte *)internal::UnknownFieldParse
                                         ((ulong)uVar5,unknown,(char *)local_38,ctx);
            goto LAB_00294229;
          }
          (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = uVar5 - 1;
          break;
        }
        uVar6 = uVar6 | 2;
        bVar1 = *p;
        uVar5 = (uint)bVar1;
        local_38 = p + 1;
        if ((char)bVar1 < '\0') {
          uVar5 = ((uint)bVar1 + (uint)*local_38 * 0x80) - 0x80;
          if ((char)*local_38 < '\0') {
            local_38 = p;
            pVar8 = internal::VarintParseSlow64((char *)p,uVar5);
            local_38 = (byte *)pVar8.first;
            this->start_ = (int32)pVar8.second;
            goto LAB_00294229;
          }
          local_38 = p + 2;
        }
        this->start_ = uVar5;
      }
      bVar2 = internal::EpsCopyInputStream::DoneWithCheck
                        (&ctx->super_EpsCopyInputStream,(char **)&local_38,ctx->group_depth_);
    } while (!bVar2);
  }
  (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | uVar6;
  return (char *)local_38;
}

Assistant:

const char* DescriptorProto_ExtensionRange::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  ::PROTOBUF_NAMESPACE_ID::Arena* arena = GetArena(); (void)arena;
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // optional int32 start = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 8)) {
          _Internal::set_has_start(&has_bits);
          start_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional int32 end = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 16)) {
          _Internal::set_has_end(&has_bits);
          end_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional .google.protobuf.ExtensionRangeOptions options = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 26)) {
          ptr = ctx->ParseMessage(_internal_mutable_options(), ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
        ptr = UnknownFieldParse(tag,
            _internal_metadata_.mutable_unknown_fields<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(),
            ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}